

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-pool.cpp
# Opt level: O0

bool __thiscall MemPool::allocBlk(MemPool *this)

{
  bool bVar1;
  MemPool *this_local;
  
  bVar1 = this->numAvailBlks < 1;
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"MEMORY FULL");
  }
  else {
    this->blkPtr = this->memPoolPtr + this->numAllocBlks * this->blkSize;
    this->memPoolUsedBlks = this->blkSize + this->memPoolUsedBlks;
    this->numAvailBlks = this->numAvailBlks + -1;
    this->numAllocBlks = this->numAllocBlks + 1;
    this->curBlkUsed = 0;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool MemPool::allocBlk() {

    if (numAvailBlks > 0) {
        blkPtr = memPoolPtr + (numAllocBlks * blkSize); // increment blkPtr by number of allocated blocks
        memPoolUsedBlks+=blkSize;
        numAvailBlks -= 1; // decrement the available number of blocks by 1
        numAllocBlks += 1; // increment the number of allocated blocks by 1
        curBlkUsed = 0;

        return true;
    }

    else {
        cout << "MEMORY FULL";
        return false;
    }
}